

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O2

void Fraig_ManFree(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *p_00;
  Fraig_NodeVec_t *p_01;
  uint **ppuVar1;
  long lVar2;
  
  if (p->fVerbose != 0) {
    if (p->fChoicing != 0) {
      Fraig_ManReportChoices(p);
    }
    Fraig_ManPrintStats(p);
  }
  p_01 = p->vNodes;
  for (lVar2 = 0; lVar2 < p_01->nSize; lVar2 = lVar2 + 1) {
    p_00 = p_01->pArray[lVar2]->vFanins;
    if (p_00 != (Fraig_NodeVec_t *)0x0) {
      Fraig_NodeVecFree(p_00);
      p_01 = p->vNodes;
      p_01->pArray[lVar2]->vFanins = (Fraig_NodeVec_t *)0x0;
    }
  }
  if (p->vInputs == (Fraig_NodeVec_t *)0x0) {
LAB_0054ec59:
    Fraig_NodeVecFree(p_01);
  }
  else {
    Fraig_NodeVecFree(p->vInputs);
    p_01 = p->vNodes;
    if (p_01 != (Fraig_NodeVec_t *)0x0) goto LAB_0054ec59;
  }
  if (p->vOutputs != (Fraig_NodeVec_t *)0x0) {
    Fraig_NodeVecFree(p->vOutputs);
  }
  if (p->pTableS != (Fraig_HashTable_t *)0x0) {
    Fraig_HashTableFree(p->pTableS);
  }
  if (p->pTableF != (Fraig_HashTable_t *)0x0) {
    Fraig_HashTableFree(p->pTableF);
  }
  if (p->pTableF0 != (Fraig_HashTable_t *)0x0) {
    Fraig_HashTableFree(p->pTableF0);
  }
  if (p->pSat != (Msat_Solver_t *)0x0) {
    Msat_SolverFree(p->pSat);
  }
  if (p->vProj != (Msat_IntVec_t *)0x0) {
    Msat_IntVecFree(p->vProj);
  }
  if (p->vCones != (Fraig_NodeVec_t *)0x0) {
    Fraig_NodeVecFree(p->vCones);
  }
  if (p->vPatsReal != (Msat_IntVec_t *)0x0) {
    Msat_IntVecFree(p->vPatsReal);
  }
  if (p->pModel != (int *)0x0) {
    free(p->pModel);
    p->pModel = (int *)0x0;
  }
  Fraig_MemFixedStop(p->mmNodes,0);
  Fraig_MemFixedStop(p->mmSims,0);
  ppuVar1 = p->pSuppS;
  if (ppuVar1 != (uint **)0x0) {
    if (*ppuVar1 != (uint *)0x0) {
      free(*ppuVar1);
      *p->pSuppS = (uint *)0x0;
      ppuVar1 = p->pSuppS;
      if (ppuVar1 == (uint **)0x0) goto LAB_0054ed4f;
    }
    free(ppuVar1);
    p->pSuppS = (uint **)0x0;
  }
LAB_0054ed4f:
  ppuVar1 = p->pSuppF;
  if (ppuVar1 != (uint **)0x0) {
    if (*ppuVar1 != (uint *)0x0) {
      free(*ppuVar1);
      *p->pSuppF = (uint *)0x0;
      ppuVar1 = p->pSuppF;
      if (ppuVar1 == (uint **)0x0) goto LAB_0054ed8f;
    }
    free(ppuVar1);
    p->pSuppF = (uint **)0x0;
  }
LAB_0054ed8f:
  if (p->ppOutputNames != (char **)0x0) {
    free(p->ppOutputNames);
    p->ppOutputNames = (char **)0x0;
  }
  free(p->ppInputNames);
  free(p);
  return;
}

Assistant:

void Fraig_ManFree( Fraig_Man_t * p )
{
    int i;
    if ( p->fVerbose )   
    {
        if ( p->fChoicing ) Fraig_ManReportChoices( p );
        Fraig_ManPrintStats( p );
//        Fraig_TablePrintStatsS( p );
//        Fraig_TablePrintStatsF( p );
//        Fraig_TablePrintStatsF0( p );
    }
 
    for ( i = 0; i < p->vNodes->nSize; i++ )
        if ( p->vNodes->pArray[i]->vFanins )
        {
            Fraig_NodeVecFree( p->vNodes->pArray[i]->vFanins );
            p->vNodes->pArray[i]->vFanins = NULL;
        }

    if ( p->vInputs )    Fraig_NodeVecFree( p->vInputs );
    if ( p->vNodes )     Fraig_NodeVecFree( p->vNodes );
    if ( p->vOutputs )   Fraig_NodeVecFree( p->vOutputs );

    if ( p->pTableS )    Fraig_HashTableFree( p->pTableS );
    if ( p->pTableF )    Fraig_HashTableFree( p->pTableF );
    if ( p->pTableF0 )   Fraig_HashTableFree( p->pTableF0 );

    if ( p->pSat )       Msat_SolverFree( p->pSat );
    if ( p->vProj )      Msat_IntVecFree( p->vProj );
    if ( p->vCones )     Fraig_NodeVecFree( p->vCones );
    if ( p->vPatsReal )  Msat_IntVecFree( p->vPatsReal );
    if ( p->pModel )     ABC_FREE( p->pModel );

    Fraig_MemFixedStop( p->mmNodes, 0 );
    Fraig_MemFixedStop( p->mmSims, 0 );

    if ( p->pSuppS )
    {
        ABC_FREE( p->pSuppS[0] );
        ABC_FREE( p->pSuppS );
    }
    if ( p->pSuppF )
    {
        ABC_FREE( p->pSuppF[0] );
        ABC_FREE( p->pSuppF );
    }

    ABC_FREE( p->ppOutputNames );
    ABC_FREE( p->ppInputNames );
    ABC_FREE( p );
}